

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnReloc
          (BinaryReaderLogging *this,RelocType type,Offset offset,Index index,uint32_t addend)

{
  Stream *this_00;
  Enum EVar1;
  char *pcVar2;
  int32_t signed_addend;
  uint32_t addend_local;
  Index index_local;
  Offset offset_local;
  RelocType type_local;
  BinaryReaderLogging *this_local;
  
  WriteIndent(this);
  this_00 = this->stream_;
  pcVar2 = GetRelocTypeName(type);
  Stream::Writef(this_00,"OnReloc(type: %s, offset: %zd, index: %u, addend: %d)\n",pcVar2,offset,
                 (ulong)index,(ulong)addend);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x98])
                    (this->reader_,(ulong)type,offset,(ulong)index,(ulong)addend);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnReloc(RelocType type,
                                    Offset offset,
                                    Index index,
                                    uint32_t addend) {
  int32_t signed_addend = static_cast<int32_t>(addend);
  LOGF("OnReloc(type: %s, offset: %" PRIzd ", index: %" PRIindex
       ", addend: %d)\n",
       GetRelocTypeName(type), offset, index, signed_addend);
  return reader_->OnReloc(type, offset, index, addend);
}